

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t gnu_sparse_01_parse(archive_read *a,tar *tar,char *p)

{
  wchar_t wVar1;
  int64_t remaining;
  bool bVar2;
  int64_t size;
  int64_t offset;
  char *e;
  char *p_local;
  tar *tar_local;
  archive_read *a_local;
  
  size = -1;
  e = p;
  do {
    offset = (int64_t)e;
    while( true ) {
      bVar2 = false;
      if (*(char *)offset != '\0') {
        bVar2 = *(char *)offset != ',';
      }
      if (!bVar2) break;
      if ((*(char *)offset < '0') || ('9' < *(char *)offset)) {
        return L'\xffffffec';
      }
      offset = offset + 1;
    }
    if (size < 0) {
      size = tar_atol10(e,offset - (long)e);
      if (size < 0) {
        return L'\xffffffec';
      }
    }
    else {
      remaining = tar_atol10(e,offset - (long)e);
      if (remaining < 0) {
        return L'\xffffffec';
      }
      wVar1 = gnu_add_sparse_entry(a,tar,size,remaining);
      if (wVar1 != L'\0') {
        return L'\xffffffe2';
      }
      size = -1;
    }
    if (*(char *)offset == '\0') {
      return L'\0';
    }
    e = (char *)(offset + 1);
  } while( true );
}

Assistant:

static int
gnu_sparse_01_parse(struct archive_read *a, struct tar *tar, const char *p)
{
	const char *e;
	int64_t offset = -1, size = -1;

	for (;;) {
		e = p;
		while (*e != '\0' && *e != ',') {
			if (*e < '0' || *e > '9')
				return (ARCHIVE_WARN);
			e++;
		}
		if (offset < 0) {
			offset = tar_atol10(p, e - p);
			if (offset < 0)
				return (ARCHIVE_WARN);
		} else {
			size = tar_atol10(p, e - p);
			if (size < 0)
				return (ARCHIVE_WARN);
			if (gnu_add_sparse_entry(a, tar, offset, size)
			    != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			offset = -1;
		}
		if (*e == '\0')
			return (ARCHIVE_OK);
		p = e + 1;
	}
}